

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv__print_handles(uv_loop_t *loop,int only_active,void *stream)

{
  uv_handle_t *h;
  uv__queue *q;
  char *type;
  void *stream_local;
  uv_loop_t *puStack_10;
  int only_active_local;
  uv_loop_t *loop_local;
  
  puStack_10 = loop;
  if (loop == (uv_loop_t *)0x0) {
    puStack_10 = uv_default_loop();
  }
  type = (char *)stream;
  if (stream == (void *)0x0) {
    type = _stderr;
  }
  for (h = (uv_handle_t *)(puStack_10->handle_queue).next;
      h != (uv_handle_t *)&puStack_10->handle_queue; h = (uv_handle_t *)h->data) {
    if ((only_active == 0) || (((ulong)h->close_cb & 4) != 0)) {
      switch(*(undefined4 *)&h[-1].next_closing) {
      case 1:
        q = (uv__queue *)0x2290b4;
        break;
      case 2:
        q = (uv__queue *)0x234fc6;
        break;
      case 3:
        q = (uv__queue *)0x22b16c;
        break;
      case 4:
        q = (uv__queue *)anon_var_dwarf_4702;
        break;
      case 5:
        q = (uv__queue *)0x24027a;
        break;
      case 6:
        q = (uv__queue *)anon_var_dwarf_c4785;
        break;
      case 7:
        q = (uv__queue *)0x23e96c;
        break;
      case 8:
        q = (uv__queue *)0x227ae6;
        break;
      case 9:
        q = (uv__queue *)0x2290ab;
        break;
      case 10:
        q = (uv__queue *)0x23ea20;
        break;
      case 0xb:
        q = (uv__queue *)0x240a9e;
        break;
      case 0xc:
        q = (uv__queue *)0x23648d;
        break;
      case 0xd:
        q = (uv__queue *)0x23871d;
        break;
      case 0xe:
        q = (uv__queue *)0x22e109;
        break;
      case 0xf:
        q = (uv__queue *)0x2277d2;
        break;
      case 0x10:
        q = (uv__queue *)0x232406;
        break;
      default:
        q = (uv__queue *)anon_var_dwarf_c4815;
      }
      fprintf((FILE *)type,"[%c%c%c] %-8s %p\n",
              (ulong)(uint)(int)"R-"[(int)(uint)((((ulong)h->close_cb & 8) != 0 ^ 0xffU) & 1)],
              (ulong)(uint)(int)"A-"[(int)(uint)((((ulong)h->close_cb & 4) != 0 ^ 0xffU) & 1)],
              (ulong)(uint)(int)"I-"[(int)(uint)((((ulong)h->close_cb & 0x10) != 0 ^ 0xffU) & 1)],q,
              &h[-1].handle_queue);
    }
  }
  return;
}

Assistant:

static void uv__print_handles(uv_loop_t* loop, int only_active, void* stream) {
  const char* type;
  struct uv__queue* q;
  uv_handle_t* h;

  if (loop == NULL)
    loop = uv_default_loop();

  if (stream == NULL)
    stream = stderr;

  uv__queue_foreach(q, &loop->handle_queue) {
    h = uv__queue_data(q, uv_handle_t, handle_queue);

    if (only_active && !uv__is_active(h))
      continue;

    switch (h->type) {
#define X(uc, lc) case UV_##uc: type = #lc; break;
      UV_HANDLE_TYPE_MAP(X)
#undef X
      default: type = "<unknown>";
    }

    fprintf(stream,
            "[%c%c%c] %-8s %p\n",
            "R-"[!(h->flags & UV_HANDLE_REF)],
            "A-"[!(h->flags & UV_HANDLE_ACTIVE)],
            "I-"[!(h->flags & UV_HANDLE_INTERNAL)],
            type,
            (void*)h);
  }
}